

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O0

int64_t __thiscall xmrig::DaemonClient::getBlockTemplate(DaemonClient *this)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *method;
  DaemonClient *in_RDI;
  int __flags;
  Value params;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document doc;
  Type in_stack_ffffffffffffff0c;
  Pool *in_stack_ffffffffffffff10;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *pGVar1;
  size_t in_stack_ffffffffffffff38;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffff40;
  Type in_stack_ffffffffffffff4c;
  undefined8 in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  StringRefType *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  Value *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  
  __flags = 0;
  pGVar1 = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *)&stack0xffffffffffffff98;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40
                    ,in_stack_ffffffffffffff38,(CrtAllocator *)pGVar1);
  method = rapidjson::
           GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           ::GetAllocator(pGVar1);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  rapidjson::GenericStringRef<char>::GenericStringRef<15u>
            ((GenericStringRef<char> *)&stack0xffffffffffffff60,(char (*) [15])"wallet_address");
  Pool::user(in_stack_ffffffffffffff10);
  String::toJSON((String *)in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
            (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff58);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&stack0xffffffffffffff50);
  rapidjson::GenericStringRef<char>::GenericStringRef<13u>
            ((GenericStringRef<char> *)&stack0xffffffffffffff40,(char (*) [13])"reserve_size");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                 (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff58);
  JsonRequest::create((Document *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(char *)method
                      ,in_stack_ffffffffffffff88);
  send(in_RDI,3,kJsonRPC,(size_t)&stack0xffffffffffffff98,__flags);
  pGVar1 = BaseClient::m_sequence;
  BaseClient::m_sequence =
       (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
        *)((long)&(BaseClient::m_sequence->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ).data_ + 1);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&stack0xffffffffffffff70);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(pGVar1);
  return (int64_t)pGVar1;
}

Assistant:

int64_t xmrig::DaemonClient::getBlockTemplate()
{
    using namespace rapidjson;
    Document doc(kObjectType);
    auto &allocator = doc.GetAllocator();

    Value params(kObjectType);
    params.AddMember("wallet_address", m_pool.user().toJSON(), allocator);
    params.AddMember("reserve_size",   8,                      allocator);

    JsonRequest::create(doc, m_sequence, "getblocktemplate", params);

    send(HTTP_POST, kJsonRPC, doc);

    return m_sequence++;
}